

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_allocator.h
# Opt level: O2

pointer __thiscall
cppcms::impl::
basic_allocator<cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>,_char>
::allocate(basic_allocator<cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>,_char>
           *this,size_type cnt,const_pointer param_2)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  pcVar1 = (pointer)shmem_allocator<char,_cppcms::impl::process_settings::process_memory>::malloc
                              ((shmem_allocator<char,_cppcms::impl::process_settings::process_memory>
                                *)this,cnt);
  if (pcVar1 != (pointer)0x0) {
    return pcVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__cxx11::string::resize;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

pointer allocate(size_type cnt, std::allocator<void>::const_pointer = 0) const
	{
		void *memory=self().malloc(cnt*sizeof(T));
		if(!memory) {
			throw std::bad_alloc();
		}
		return (pointer)memory;
	}